

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

void cuddLocalCacheClearDead(DdManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdLocalCache *pDVar4;
  DdLocalCacheItem *pDVar5;
  uint uVar6;
  ulong uVar7;
  
  pDVar4 = manager->localCaches;
  do {
    if (pDVar4 == (DdLocalCache *)0x0) {
      return;
    }
    uVar1 = pDVar4->slots;
    if (uVar1 != 0) {
      uVar2 = pDVar4->keysize;
      pDVar5 = pDVar4->item;
      uVar3 = pDVar4->itemsize;
      uVar6 = 0;
      do {
        if (pDVar5->value != (DdNode *)0x0) {
          if (*(int *)(((ulong)pDVar5->value & 0xfffffffffffffffe) + 4) == 0) {
LAB_0078ba20:
            pDVar5->value = (DdNode *)0x0;
          }
          else if ((ulong)uVar2 != 0) {
            uVar7 = 0;
            do {
              if (*(int *)(((ulong)pDVar5->key[uVar7] & 0xfffffffffffffffe) + 4) == 0)
              goto LAB_0078ba20;
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
        }
        pDVar5 = (DdLocalCacheItem *)((long)pDVar5->key + ((ulong)uVar3 - 8));
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    pDVar4 = pDVar4->next;
  } while( true );
}

Assistant:

void
cuddLocalCacheClearDead(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;
    unsigned int keysize;
    unsigned int itemsize;
    unsigned int slots;
    DdLocalCacheItem *item;
    DdNodePtr *key;
    unsigned int i, j;

    while (cache != NULL) {
        keysize = cache->keysize;
        itemsize = cache->itemsize;
        slots = cache->slots;
        item = cache->item;
        for (i = 0; i < slots; i++) {
            if (item->value != NULL) {
                if (Cudd_Regular(item->value)->ref == 0) {
                    item->value = NULL;
                } else {
                    key = item->key;
                    for (j = 0; j < keysize; j++) {
                        if (Cudd_Regular(key[j])->ref == 0) {
                            item->value = NULL;
                            break;
                        }
                    }
                }
            }
            item = (DdLocalCacheItem *) ((char *) item + itemsize);
        }
        cache = cache->next;
    }
    return;

}